

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# snowhouse.h
# Opt level: O2

void __thiscall
bandit::adapter::snowhouse::adapt_exceptions(snowhouse *this,function<void_()> *func)

{
  std::function<void_()>::operator()(func);
  return;
}

Assistant:

void adapt_exceptions(std::function<void()> func) override {
        try {
          func();
        } catch (const ::snowhouse::AssertionException& ex) {
          throw detail::assertion_exception(ex.GetMessage(), ex.GetFilename(), ex.GetLineNumber());
        }
      }